

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

Result * __thiscall
CoreML::
validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,int maxFeatureCount,
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          *allowedFeatureTypes)

{
  undefined4 uVar1;
  _Base_ptr allowedFeatureTypes_00;
  bool bVar2;
  int iVar3;
  FeatureDescription *featureDesc;
  undefined4 in_register_0000000c;
  Result local_d0;
  int i;
  string local_80;
  undefined1 local_50 [8];
  Result result;
  int maxFeatureCount_local;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features_local;
  
  result.m_message.super__Rb_tree_node_base._M_right =
       (_Base_ptr)CONCAT44(in_register_0000000c,maxFeatureCount);
  result.m_message._M_storage._M_storage._4_4_ = SUB84(features,0);
  Result::Result((Result *)local_50);
  if (result.m_message._M_storage._M_storage._4_4_ != 0) {
    iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this);
    if ((int)result.m_message._M_storage._M_storage._4_4_ < iVar3) {
      std::__cxx11::to_string((string *)&i,result.m_message._M_storage._M_storage._4_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                     "Feature descriptions exceeded ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&i);
      goto LAB_0035fc28;
    }
  }
  local_d0.m_message._M_storage._M_storage[0] = '\0';
  local_d0.m_message._M_storage._M_storage[1] = '\0';
  local_d0.m_message._M_storage._M_storage[2] = '\0';
  local_d0.m_message._M_storage._M_storage[3] = '\0';
  while( true ) {
    uVar1 = local_d0.m_message._M_storage._M_storage._0_4_;
    iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this);
    allowedFeatureTypes_00 = result.m_message.super__Rb_tree_node_base._M_right;
    if (iVar3 <= (int)uVar1) break;
    featureDesc = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                  operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this,
                             local_d0.m_message._M_storage._M_storage._0_4_);
    validateSchemaTypes(&local_d0,
                        (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)allowedFeatureTypes_00,featureDesc);
    Result::operator=((Result *)local_50,&local_d0);
    Result::~Result(&local_d0);
    bVar2 = Result::good((Result *)local_50);
    if (!bVar2) {
      Result::Result(__return_storage_ptr__,(Result *)local_50);
      goto LAB_0035fc28;
    }
    local_d0.m_message._M_storage._M_storage._0_4_ =
         local_d0.m_message._M_storage._M_storage._0_4_ + 1;
  }
  Result::Result(__return_storage_ptr__,(Result *)local_50);
LAB_0035fc28:
  local_d0.m_message._M_storage._M_storage[4] = '\x01';
  local_d0.m_message._M_storage._M_storage[5] = '\0';
  local_d0.m_message._M_storage._M_storage[6] = '\0';
  local_d0.m_message._M_storage._M_storage[7] = '\0';
  Result::~Result((Result *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDescriptionsContainFeatureWithTypes(const Descriptions &features,
                                                              int maxFeatureCount,
                                                              const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes) {
        Result result;
        
        // 0 means no maximum fixed feature count.
        if (maxFeatureCount != 0 && features.size() > maxFeatureCount) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE, "Feature descriptions exceeded " + std::to_string(maxFeatureCount));
        }
        
        for (int i = 0; i < features.size(); i++) {
            result = validateSchemaTypes(allowedFeatureTypes, features[i]);
            if (!result.good()) {
                return result;
            }
        }
        
        return result;
    }